

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O2

void EPSG_setFlags(EPSG *psg,UINT8 flags)

{
  byte bVar1;
  
  psg->chp_flags = flags;
  internal_refresh(psg);
  bVar1 = psg->chp_flags;
  psg->stereo_mask[0] = (byte)~bVar1 >> 6 | 1;
  psg->stereo_mask[1] = '\x03';
  psg->stereo_mask[2] = (byte)~bVar1 >> 7 | 2;
  return;
}

Assistant:

void
EPSG_setFlags (EPSG * psg, UINT8 flags)
{
  psg->chp_flags = flags;

  internal_refresh(psg);  // in case of changed clock divider pin

  if (psg->chp_flags & AY8910_ZX_STEREO)
  {
    // ABC Stereo
    psg->stereo_mask[0] = 0x01;
    psg->stereo_mask[1] = 0x03;
    psg->stereo_mask[2] = 0x02;
  }
  else
  {
    psg->stereo_mask[0] = 0x03;
    psg->stereo_mask[1] = 0x03;
    psg->stereo_mask[2] = 0x03;
  }

  return;
}